

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManProfileTruths(Mf_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int *pCut_00;
  word *pTruth;
  int Counter;
  int *pCut;
  int Entry;
  int i;
  Vec_Int_t *vCounts;
  Mf_Man_t *p_local;
  
  iVar1 = Vec_IntSize(&p->vCnfSizes);
  p_00 = Vec_IntStart(iVar1);
  for (pCut._4_4_ = 0; (int)pCut._4_4_ < p->pGia->nObjs; pCut._4_4_ = pCut._4_4_ + 1) {
    pObj = Gia_ManObj(p->pGia,pCut._4_4_);
    iVar1 = Gia_ObjIsAnd(pObj);
    if ((iVar1 != 0) && (iVar1 = Mf_ObjMapRefNum(p,pCut._4_4_), iVar1 != 0)) {
      pCut_00 = Mf_ObjCutBest(p,pCut._4_4_);
      iVar1 = Mf_CutFunc(pCut_00);
      iVar1 = Abc_Lit2Var(iVar1);
      Vec_IntAddToEntry(p_00,iVar1,1);
    }
  }
  for (pCut._4_4_ = 0; iVar1 = Vec_IntSize(p_00), (int)pCut._4_4_ < iVar1;
      pCut._4_4_ = pCut._4_4_ + 1) {
    uVar2 = Vec_IntEntry(p_00,pCut._4_4_);
    if (uVar2 != 0) {
      printf("%6d : ");
      printf("%6d : ",(ulong)pCut._4_4_);
      printf("Occur = %4d  ",(ulong)uVar2);
      uVar2 = Vec_IntEntry(&p->vCnfSizes,pCut._4_4_);
      printf("CNF size = %2d  ",(ulong)uVar2);
      pTruth = Vec_MemReadEntry(p->vTtMem,pCut._4_4_);
      Dau_DsdPrintFromTruth(pTruth,p->pPars->nLutSize);
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Mf_ManProfileTruths( Mf_Man_t * p )
{
    Vec_Int_t * vCounts;
    int i, Entry, * pCut, Counter = 0;
    vCounts = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntAddToEntry( vCounts, Abc_Lit2Var(Mf_CutFunc(pCut)), 1 );
    }
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( Entry == 0 )
            continue;
        printf( "%6d : ", Counter++ );
        printf( "%6d : ", i );
        printf( "Occur = %4d  ", Entry ); 
        printf( "CNF size = %2d  ", Vec_IntEntry(&p->vCnfSizes, i) );
        Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, i), p->pPars->nLutSize );
    }
    Vec_IntFree( vCounts );
}